

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearlyTransformedCosines.cpp
# Opt level: O0

void __thiscall
arealights::LinearlyTransformedCosines::~LinearlyTransformedCosines
          (LinearlyTransformedCosines *this)

{
  LinearlyTransformedCosines *this_local;
  
  std::vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_>::~vector
            (&this->_lights);
  std::unique_ptr<fw::Texture,_std::default_delete<fw::Texture>_>::~unique_ptr
            (&this->_ltcLookupMatB);
  std::unique_ptr<fw::Texture,_std::default_delete<fw::Texture>_>::~unique_ptr
            (&this->_ltcLookupMatA);
  std::unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::~unique_ptr
            (&this->_ltcShader);
  std::shared_ptr<arealights::RenderHelper>::~shared_ptr(&this->_renderHelper);
  return;
}

Assistant:

LinearlyTransformedCosines::~LinearlyTransformedCosines()
{
}